

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O1

void __thiscall OpenMD::GenericData::GenericData(GenericData *this,string *id)

{
  this->_vptr_GenericData = (_func_int **)&PTR__GenericData_002ff4c0;
  (this->id_)._M_dataplus._M_p = (pointer)&(this->id_).field_2;
  (this->id_)._M_string_length = 0;
  (this->id_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->id_);
  return;
}

Assistant:

GenericData(const std::string& id) { setID(id); }